

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

void glfwSwapBuffers(GLFWwindow *handle)

{
  char *format;
  int code;
  _GLFWwindow *window;
  
  if (_glfw.initialized == 0) {
    code = 0x10001;
    format = (char *)0x0;
  }
  else {
    if (*(int *)(handle + 0x200) != 0) {
      (**(code **)(handle + 0x250))();
      return;
    }
    format = "Cannot swap buffers of a window that has no OpenGL or OpenGL ES context";
    code = 0x1000a;
  }
  _glfwInputError(code,format);
  return;
}

Assistant:

GLFWAPI void glfwSwapBuffers(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    if (window->context.client == GLFW_NO_API)
    {
        _glfwInputError(GLFW_NO_WINDOW_CONTEXT,
                        "Cannot swap buffers of a window that has no OpenGL or OpenGL ES context");
        return;
    }

    window->context.swapBuffers(window);
}